

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTInstanceOf
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var object,Var constructor)

{
  EventLogEntry *actionEvent;
  EventLogEntry *evt;
  JsRTDoubleVarArgumentAction *gpAction;
  Var constructor_local;
  Var object_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  gpAction = (JsRTDoubleVarArgumentAction *)constructor;
  constructor_local = object;
  object_local = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)46>
                          (this,(JsRTVarsArgumentAction_InternalUse<2UL> **)&evt);
  NSLogEvents::SetVarItem_0<2ul>((JsRTVarsArgumentAction_InternalUse<2UL> *)evt,constructor_local);
  NSLogEvents::SetVarItem_1<2ul>((JsRTVarsArgumentAction_InternalUse<2UL> *)evt,gpAction);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnter
            ((TTDJsRTActionResultAutoRecorder *)object_local,actionEvent);
  return;
}

Assistant:

void EventLog::RecordJsRTInstanceOf(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var object, Js::Var constructor)
    {
        NSLogEvents::JsRTDoubleVarArgumentAction* gpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTDoubleVarArgumentAction, NSLogEvents::EventKind::InstanceOfActionTag>(&gpAction);
        NSLogEvents::SetVarItem_0(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(object));
        NSLogEvents::SetVarItem_1(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(constructor));

        actionPopper.InitializeWithEventAndEnter(evt);
    }